

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O2

Min_Cube_t * Min_CubeAlloc(Min_Man_t *p)

{
  uint uVar1;
  Min_Cube_t *pMVar2;
  
  pMVar2 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
  pMVar2->pNext = (Min_Cube_t *)0x0;
  uVar1 = p->nVars & 0x3ff;
  *(uint *)&pMVar2->field_0x8 = *(uint *)&pMVar2->field_0x8 & 0xfffffc00 | uVar1;
  *(uint *)&pMVar2->field_0x8 = (p->nWords & 0xfffU) << 10 | uVar1;
  memset(pMVar2->uData,0xff,(long)p->nWords << 2);
  return pMVar2;
}

Assistant:

static inline Min_Cube_t * Min_CubeAlloc( Min_Man_t * p )
{
    Min_Cube_t * pCube;
    pCube = (Min_Cube_t *)Extra_MmFixedEntryFetch( p->pMemMan );
    pCube->pNext  = NULL;
    pCube->nVars  = p->nVars;
    pCube->nWords = p->nWords;
    pCube->nLits  = 0;
    memset( pCube->uData, 0xff, sizeof(unsigned) * p->nWords );
    return pCube;
}